

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O0

void __thiscall
hiberlite::ExtractModel::notifyInitWalk<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av)

{
  mapped_type *this_00;
  Scope local_f8;
  undefined1 local_b0 [120];
  undefined1 local_38 [40];
  AVisitor<hiberlite::ExtractModel> *av_local;
  ExtractModel *this_local;
  
  local_38._32_8_ = av;
  av_local = (AVisitor<hiberlite::ExtractModel> *)this;
  AVisitor<hiberlite::ExtractModel>::getScope((Scope *)(local_b0 + 0x30),av);
  Scope::table_abi_cxx11_((Scope *)local_38);
  AVisitor<hiberlite::ExtractModel>::getScope
            (&local_f8,(AVisitor<hiberlite::ExtractModel> *)local_38._32_8_);
  Scope::table_abi_cxx11_((Scope *)local_b0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                          *)this,(key_type *)local_b0);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_38);
  std::__cxx11::string::~string((string *)local_b0);
  Scope::~Scope(&local_f8);
  std::__cxx11::string::~string((string *)local_38);
  Scope::~Scope((Scope *)(local_b0 + 0x30));
  return;
}

Assistant:

inline void notifyInitWalk(AV& av){
			model[av.getScope().table()].name=av.getScope().table();
		}